

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O2

stringpiece_ssize_type __thiscall
google::protobuf::StringPiece::find_last_of(StringPiece *this,StringPiece s,size_type pos)

{
  long lVar1;
  size_type sVar2;
  stringpiece_ssize_type sVar3;
  bool *table;
  char *pcVar4;
  ulong uVar5;
  StringPiece characters_wanted;
  size_type sStack_140;
  bool lookup [256];
  
  pcVar4 = (char *)s.length_;
  lVar1 = this->length_;
  table = (bool *)CONCAT71((int7)(pos >> 8),(long)pcVar4 < 1 || lVar1 < 1);
  if ((long)pcVar4 < 1 || lVar1 < 1) {
    sVar2 = 0xffffffffffffffff;
  }
  else {
    if (pcVar4 == (char *)0x1) {
      sVar3 = rfind(this,(char)*(protobuf *)s.ptr_,pos);
      return sVar3;
    }
    memset(lookup,0,0x100);
    characters_wanted.length_ = (stringpiece_ssize_type)lookup;
    characters_wanted.ptr_ = pcVar4;
    BuildLookupTable((protobuf *)s.ptr_,characters_wanted,table);
    uVar5 = lVar1 - 1U;
    if (pos <= lVar1 - 1U) {
      uVar5 = pos;
    }
    sStack_140 = 0xffffffffffffffff;
    while ((sVar2 = sStack_140, -1 < (long)uVar5 &&
           (sVar2 = uVar5, lookup[(byte)this->ptr_[uVar5]] == false))) {
      uVar5 = uVar5 - 1;
    }
  }
  return sVar2;
}

Assistant:

stringpiece_ssize_type StringPiece::find_last_of(StringPiece s,
                                                 size_type pos) const {
  if (length_ <= 0 || s.length_ <= 0) return npos;
  // Avoid the cost of BuildLookupTable() for a single-character search.
  if (s.length_ == 1) return find_last_of(s.ptr_[0], pos);

  bool lookup[UCHAR_MAX + 1] = { false };
  BuildLookupTable(s, lookup);
  for (stringpiece_ssize_type i =
       std::min(pos, static_cast<size_type>(length_ - 1)); i >= 0; --i) {
    if (lookup[static_cast<unsigned char>(ptr_[i])]) {
      return i;
    }
  }
  return npos;
}